

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayerBuilder.cpp
# Opt level: O0

ILayer * __thiscall DenseVanillaLayerBuilder::Build(DenseVanillaLayerBuilder *this,LayerMeta *meta)

{
  ILayer *this_00;
  LayerMeta local_58;
  LayerMeta *local_18;
  LayerMeta *meta_local;
  DenseVanillaLayerBuilder *this_local;
  
  local_18 = meta;
  meta_local = (LayerMeta *)this;
  this_00 = (ILayer *)operator_new(0x160);
  LayerMeta::LayerMeta(&local_58,meta);
  DenseVanillaLayer::DenseVanillaLayer((DenseVanillaLayer *)this_00,&local_58);
  LayerMeta::~LayerMeta(&local_58);
  return this_00;
}

Assistant:

ILayer *DenseVanillaLayerBuilder::Build( LayerMeta meta ) const
{
    return new DenseVanillaLayer( meta );
}